

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O2

vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *
s2coding::ConvertCellsToValues
          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *__return_storage_ptr__,
          vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_> *cell_points,int level,
          bool *have_exceptions)

{
  pointer pCVar1;
  char cVar2;
  pointer pCVar3;
  uint64 v;
  S2LogMessage local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::reserve
            (__return_storage_ptr__,
             ((long)(cell_points->
                    super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(cell_points->
                   super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0xc);
  *have_exceptions = false;
  cVar2 = (char)level;
  pCVar3 = (cell_points->
           super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (cell_points->
           super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pCVar3 == pCVar1) {
      return __return_storage_ptr__;
    }
    if (pCVar3->level == level) {
      v = InterleaveUint32BitPairs
                    ((pCVar3->si >> 1 | (uint)(byte)pCVar3->face << 0x1e) >> (0x1eU - cVar2 & 0x1f),
                     (((byte)pCVar3->face & 0xfffffffc) << 0x1d | pCVar3->ti) >>
                     (0x1fU - cVar2 & 0x1f));
      if (0xffffffffffffffffU >> (cVar2 * -2 + 0x3dU & 0x3f) < v) {
        S2LogMessage::S2LogMessage
                  (&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                   ,0x24f,kFatal,(ostream *)&std::cerr);
        std::operator<<(local_40.stream_,"Check failed: (v) <= (BitMask(MaxBitsForLevel(level))) ");
        abort();
      }
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (__return_storage_ptr__,&v);
    }
    else {
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (__return_storage_ptr__,&kException);
      *have_exceptions = true;
    }
    pCVar3 = pCVar3 + 1;
  } while( true );
}

Assistant:

vector<uint64> ConvertCellsToValues(const vector<CellPoint>& cell_points,
                                    int level, bool* have_exceptions) {
  vector<uint64> values;
  values.reserve(cell_points.size());
  *have_exceptions = false;
  int shift = S2CellId::kMaxLevel - level;
  for (CellPoint cp : cell_points) {
    if (cp.level != level) {
      values.push_back(kException);
      *have_exceptions = true;
    } else {
      // Note that bit 31 of tj is always zero, and that bits are interleaved in
      // such a way that bit 63 of the result is always zero.
      //
      // The S2CellId version of the following code is:
      // uint64 v = S2CellId::FromFaceIJ(cp.face, cp.si >> 1, cp.ti >> 1).
      //            parent(level).id() >> (2 * shift + 1);
      uint32 sj = (((cp.face & 3) << 30) | (cp.si >> 1)) >> shift;
      uint32 tj = (((cp.face & 4) << 29) | cp.ti) >> (shift + 1);
      uint64 v = InterleaveUint32BitPairs(sj, tj);
      S2_DCHECK_LE(v, BitMask(MaxBitsForLevel(level)));
      values.push_back(v);
    }
  }
  return values;
}